

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenTableBuilders
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  size_t local_40;
  difference_type offset;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_28;
  const_iterator it;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  GetStartOfTable(this,struct_def,code_ptr);
  local_28._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_28);
    offset = (difference_type)*ppFVar2;
    if ((((FieldDef *)offset)->deprecated & 1U) == 0) {
      local_48._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (&(struct_def->fields).vec);
      local_40 = __gnu_cxx::operator-(&local_28,&local_48);
      BuildFieldOfTable(this,struct_def,(FieldDef *)offset,local_40,(string *)it._M_current);
      bVar1 = IsVector((Type *)(offset + 200));
      if (bVar1) {
        BuildVectorOfTable(this,struct_def,(FieldDef *)offset,(string *)it._M_current);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_28);
  }
  GetEndOffsetOnTable(this,struct_def,(string *)it._M_current);
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    GetStartOfTable(struct_def, code_ptr);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      auto offset = it - struct_def.fields.vec.begin();
      BuildFieldOfTable(struct_def, field, offset, code_ptr);
      if (IsVector(field.value.type)) {
        BuildVectorOfTable(struct_def, field, code_ptr);
      }
    }

    GetEndOffsetOnTable(struct_def, code_ptr);
  }